

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# OPC_OptimizedTree.cpp
# Opt level: O0

bool __thiscall Opcode::AABBQuantizedNoLeafTree::Build(AABBQuantizedNoLeafTree *this,AABBTree *tree)

{
  udword uVar1;
  undefined1 auVar2 [16];
  undefined1 auVar3 [16];
  bool bVar4;
  AABBQuantizedNoLeafNode *pAVar5;
  ulong uVar6;
  ulong uVar7;
  ulong *puVar8;
  ulong *puVar9;
  AABBNoLeafNode *linear;
  AABBQuantizedNoLeafNode *pAVar10;
  AABBNoLeafNode *pAVar11;
  ulong uVar12;
  float fVar13;
  float fVar14;
  float local_340;
  float local_33c;
  float local_338;
  float local_334;
  float local_330;
  float local_32c;
  float local_328;
  float local_324;
  float local_320;
  float local_31c;
  float local_318;
  float local_314;
  AABBQuantizedNoLeafNode *local_300;
  AABBNoLeafNode *local_2d0;
  udword Nb_1;
  udword Nb;
  float qe;
  uint uStack_278;
  bool FixMe;
  float qc;
  udword j;
  Point Min;
  Point Max;
  udword i_1;
  uintptr_t Data;
  Point EQuantCoeff;
  Point CQuantCoeff;
  udword nbe;
  udword nbc;
  udword i;
  Point EMax;
  Point CMax;
  udword CurID;
  AABBNoLeafNode *Nodes;
  udword NbNodes;
  udword NbTriangles;
  AABBTree *tree_local;
  AABBQuantizedNoLeafTree *this_local;
  
  if (tree == (AABBTree *)0x0) {
    this_local._7_1_ = false;
  }
  else {
    uVar1 = (tree->super_AABBTreeNode).mNbPrimitives;
    if (tree->mTotalNbNodes == uVar1 * 2 - 1) {
      (this->super_AABBOptimizedTree).mNbNodes = uVar1 - 1;
      if (this->mNodes != (AABBQuantizedNoLeafNode *)0x0) {
        pAVar10 = this->mNodes;
        if (pAVar10 != (AABBQuantizedNoLeafNode *)0x0) {
          for (pAVar5 = pAVar10 + pAVar10[-1].mNegData; pAVar10 != pAVar5; pAVar5 = pAVar5 + -1) {
          }
          operator_delete__(&pAVar10[-1].mNegData,pAVar10[-1].mNegData * 0x20 + 8);
        }
        this->mNodes = (AABBQuantizedNoLeafNode *)0x0;
      }
      uVar6 = CONCAT44(0,(this->super_AABBOptimizedTree).mNbNodes);
      auVar2._8_8_ = 0;
      auVar2._0_8_ = uVar6;
      uVar7 = SUB168(auVar2 * ZEXT816(0x28),0);
      uVar12 = uVar7 + 8;
      if (SUB168(auVar2 * ZEXT816(0x28),8) != 0 || 0xfffffffffffffff7 < uVar7) {
        uVar12 = 0xffffffffffffffff;
      }
      puVar8 = (ulong *)operator_new__(uVar12);
      *puVar8 = uVar6;
      linear = (AABBNoLeafNode *)(puVar8 + 1);
      if (uVar6 != 0) {
        local_2d0 = linear;
        do {
          local_2d0->mPosData = 0;
          local_2d0->mNegData = 0;
          local_2d0 = local_2d0 + 1;
        } while (local_2d0 != linear + uVar6);
      }
      if (linear == (AABBNoLeafNode *)0x0) {
        this_local._7_1_ = false;
      }
      else {
        CMax.y = 1.4013e-45;
        _BuildNoLeafTree(linear,0,(udword *)&CMax.y,&tree->super_AABBTreeNode);
        uVar6 = CONCAT44(0,(this->super_AABBOptimizedTree).mNbNodes);
        auVar3._8_8_ = 0;
        auVar3._0_8_ = uVar6;
        uVar7 = SUB168(auVar3 * ZEXT816(0x20),0);
        uVar12 = uVar7 + 8;
        if (SUB168(auVar3 * ZEXT816(0x20),8) != 0 || 0xfffffffffffffff7 < uVar7) {
          uVar12 = 0xffffffffffffffff;
        }
        puVar9 = (ulong *)operator_new__(uVar12);
        *puVar9 = uVar6;
        pAVar10 = (AABBQuantizedNoLeafNode *)(puVar9 + 1);
        if (uVar6 != 0) {
          local_300 = pAVar10;
          do {
            local_300->mPosData = 0;
            local_300->mNegData = 0;
            local_300 = local_300 + 1;
          } while (local_300 != pAVar10 + uVar6);
        }
        this->mNodes = pAVar10;
        if (this->mNodes == (AABBQuantizedNoLeafNode *)0x0) {
          this_local._7_1_ = false;
        }
        else {
          EMax.y = -3.4028235e+38;
          EMax.z = -3.4028235e+38;
          CMax.x = -3.4028235e+38;
          nbc = 0xff7fffff;
          i = 0xff7fffff;
          EMax.x = -3.4028235e+38;
          for (nbe = 0; nbe < (this->super_AABBOptimizedTree).mNbNodes; nbe = nbe + 1) {
            if (EMax.y < ABS(linear[nbe].mAABB.mCenter.x)) {
              EMax.y = ABS(linear[nbe].mAABB.mCenter.x);
            }
            if (EMax.z < ABS(linear[nbe].mAABB.mCenter.y)) {
              EMax.z = ABS(linear[nbe].mAABB.mCenter.y);
            }
            if (CMax.x < ABS(linear[nbe].mAABB.mCenter.z)) {
              CMax.x = ABS(linear[nbe].mAABB.mCenter.z);
            }
            if ((float)nbc < ABS(linear[nbe].mAABB.mExtents.x)) {
              nbc = (udword)ABS(linear[nbe].mAABB.mExtents.x);
            }
            if ((float)i < ABS(linear[nbe].mAABB.mExtents.y)) {
              i = (udword)ABS(linear[nbe].mAABB.mExtents.y);
            }
            if (EMax.x < ABS(linear[nbe].mAABB.mExtents.z)) {
              EMax.x = ABS(linear[nbe].mAABB.mExtents.z);
            }
          }
          CQuantCoeff.y._0_1_ = 0xf;
          if ((gFixQuantized & 1U) == 0) {
            CQuantCoeff.y._0_1_ = 0x10;
          }
          if ((EMax.y != 0.0) || (NAN(EMax.y))) {
            local_314 = 32767.0 / EMax.y;
          }
          else {
            local_314 = 0.0;
          }
          if ((EMax.z != 0.0) || (NAN(EMax.z))) {
            local_318 = 32767.0 / EMax.z;
          }
          else {
            local_318 = 0.0;
          }
          if ((CMax.x != 0.0) || (NAN(CMax.x))) {
            local_31c = 32767.0 / CMax.x;
          }
          else {
            local_31c = 0.0;
          }
          if (((float)nbc != 0.0) || (NAN((float)nbc))) {
            local_320 = (float)((1 << CQuantCoeff.y._0_1_) + -1) / (float)nbc;
          }
          else {
            local_320 = 0.0;
          }
          if (((float)i != 0.0) || (NAN((float)i))) {
            local_324 = (float)((1 << CQuantCoeff.y._0_1_) + -1) / (float)i;
          }
          else {
            local_324 = 0.0;
          }
          if ((EMax.x != 0.0) || (NAN(EMax.x))) {
            local_328 = (float)((1 << CQuantCoeff.y._0_1_) + -1) / EMax.x;
          }
          else {
            local_328 = 0.0;
          }
          if ((local_314 != 0.0) || (NAN(local_314))) {
            local_32c = 1.0 / local_314;
          }
          else {
            local_32c = 0.0;
          }
          (this->mCenterCoeff).x = local_32c;
          if ((local_318 != 0.0) || (NAN(local_318))) {
            local_330 = 1.0 / local_318;
          }
          else {
            local_330 = 0.0;
          }
          (this->mCenterCoeff).y = local_330;
          if ((local_31c != 0.0) || (NAN(local_31c))) {
            local_334 = 1.0 / local_31c;
          }
          else {
            local_334 = 0.0;
          }
          (this->mCenterCoeff).z = local_334;
          if ((local_320 != 0.0) || (NAN(local_320))) {
            local_338 = 1.0 / local_320;
          }
          else {
            local_338 = 0.0;
          }
          (this->mExtentsCoeff).x = local_338;
          if ((local_324 != 0.0) || (NAN(local_324))) {
            local_33c = 1.0 / local_324;
          }
          else {
            local_33c = 0.0;
          }
          (this->mExtentsCoeff).y = local_33c;
          if ((local_328 != 0.0) || (NAN(local_328))) {
            local_340 = 1.0 / local_328;
          }
          else {
            local_340 = 0.0;
          }
          (this->mExtentsCoeff).z = local_340;
          for (Max.y = 0.0; (uint)Max.y < (this->super_AABBOptimizedTree).mNbNodes;
              Max.y = (float)((int)Max.y + 1)) {
            this->mNodes[(uint)Max.y].mAABB.mCenter[0] =
                 (sword)(int)(linear[(uint)Max.y].mAABB.mCenter.x * local_314);
            this->mNodes[(uint)Max.y].mAABB.mCenter[1] =
                 (sword)(int)(*(float *)((long)puVar8 + (ulong)(uint)Max.y * 0x28 + 0xc) * local_318
                             );
            this->mNodes[(uint)Max.y].mAABB.mCenter[2] =
                 (sword)(int)(*(float *)(puVar8 + (ulong)(uint)Max.y * 5 + 2) * local_31c);
            this->mNodes[(uint)Max.y].mAABB.mExtents[0] =
                 (uword)(int)(*(float *)((long)puVar8 + (ulong)(uint)Max.y * 0x28 + 0x14) *
                             local_320);
            this->mNodes[(uint)Max.y].mAABB.mExtents[1] =
                 (uword)(int)(*(float *)(puVar8 + (ulong)(uint)Max.y * 5 + 3) * local_324);
            this->mNodes[(uint)Max.y].mAABB.mExtents[2] =
                 (uword)(int)(*(float *)((long)puVar8 + (ulong)(uint)Max.y * 0x28 + 0x1c) *
                             local_328);
            if ((gFixQuantized & 1U) != 0) {
              Min.y = linear[(uint)Max.y].mAABB.mCenter.x + linear[(uint)Max.y].mAABB.mExtents.x;
              Min.z = linear[(uint)Max.y].mAABB.mCenter.y + linear[(uint)Max.y].mAABB.mExtents.y;
              pAVar11 = linear + (uint)Max.y;
              qc = (pAVar11->mAABB).mCenter.x - linear[(uint)Max.y].mAABB.mExtents.x;
              j = (udword)((pAVar11->mAABB).mCenter.y - linear[(uint)Max.y].mAABB.mExtents.y);
              Min.x = (pAVar11->mAABB).mCenter.z - linear[(uint)Max.y].mAABB.mExtents.z;
              for (uStack_278 = 0; uStack_278 < 3; uStack_278 = uStack_278 + 1) {
                fVar13 = (float)(int)this->mNodes[(uint)Max.y].mAABB.mCenter[uStack_278] *
                         (&(this->mCenterCoeff).x)[uStack_278];
                bVar4 = true;
                do {
                  fVar14 = (float)this->mNodes[(uint)Max.y].mAABB.mExtents[uStack_278] *
                           (&(this->mExtentsCoeff).x)[uStack_278];
                  if ((fVar13 + fVar14 < (&Min.y)[uStack_278]) ||
                     (fVar14 = fVar13 - fVar14,
                     (&qc)[uStack_278] <= fVar14 && fVar14 != (&qc)[uStack_278])) {
                    this->mNodes[(uint)Max.y].mAABB.mExtents[uStack_278] =
                         this->mNodes[(uint)Max.y].mAABB.mExtents[uStack_278] + 1;
                  }
                  else {
                    bVar4 = false;
                  }
                  if (this->mNodes[(uint)Max.y].mAABB.mExtents[uStack_278] == 0) {
                    this->mNodes[(uint)Max.y].mAABB.mExtents[uStack_278] = 0xffff;
                    bVar4 = false;
                  }
                } while (bVar4);
              }
            }
            unique0x00012000 = (AABBQuantizedNoLeafNode *)linear[(uint)Max.y].mPosData;
            if (((ulong)unique0x00012000 & 1) == 0) {
              register0x00000000 = this->mNodes + (uint)((int)unique0x00012000 - (int)linear) / 0x28
              ;
            }
            this->mNodes[(uint)Max.y].mPosData = (uintptr_t)stack0xfffffffffffffda8;
            unique0x00012000 = (AABBQuantizedNoLeafNode *)linear[(uint)Max.y].mNegData;
            if (((ulong)unique0x00012000 & 1) == 0) {
              register0x00000000 = this->mNodes + (uint)((int)unique0x00012000 - (int)linear) / 0x28
              ;
            }
            this->mNodes[(uint)Max.y].mNegData = (uintptr_t)stack0xfffffffffffffda8;
          }
          if ((linear != (AABBNoLeafNode *)0x0) && (linear != (AABBNoLeafNode *)0x0)) {
            for (pAVar11 = linear + *puVar8; linear != pAVar11; pAVar11 = pAVar11 + -1) {
            }
            operator_delete__(puVar8,*puVar8 * 0x28 + 8);
          }
          this_local._7_1_ = true;
        }
      }
    }
    else {
      this_local._7_1_ = false;
    }
  }
  return this_local._7_1_;
}

Assistant:

bool AABBQuantizedNoLeafTree::Build(AABBTree* tree)
{
	// Checkings
	if(!tree)	return false;
	// Check the input tree is complete
	udword NbTriangles	= tree->GetNbPrimitives();
	udword NbNodes		= tree->GetNbNodes();
	if(NbNodes!=NbTriangles*2-1)	return false;

	// Get nodes
	mNbNodes = NbTriangles-1;
	DELETEARRAY(mNodes);
	AABBNoLeafNode* Nodes = new AABBNoLeafNode[mNbNodes];
	CHECKALLOC(Nodes);

	// Build the tree
	udword CurID = 1;
	_BuildNoLeafTree(Nodes, 0, CurID, tree);
	ASSERT(CurID==mNbNodes);

	// Quantize
	{
		mNodes = new AABBQuantizedNoLeafNode[mNbNodes];
		CHECKALLOC(mNodes);

		// Get max values
		FIND_MAX_VALUES

		// Quantization
		INIT_QUANTIZATION

		// Quantize
		uintptr_t Data;
		for(udword i=0;i<mNbNodes;i++)
		{
			PERFORM_QUANTIZATION
			REMAP_DATA(mPosData)
			REMAP_DATA(mNegData)
		}

		DELETEARRAY(Nodes);
	}

	return true;
}